

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

bool kratos::TransformIfCase::has_target_if
               (Stmt *stmt,Var **var,
               vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
               *if_stmts)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  _func_int *p_Var2;
  Stmt *stmt_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  undefined1 local_48 [8];
  shared_ptr<kratos::Expr> expr;
  shared_ptr<kratos::IfStmt> if_;
  
  if (stmt->type_ != If) {
    return 0x10 < (ulong)((long)(if_stmts->
                                super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(if_stmts->
                               super__Vector_base<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
  }
  Stmt::as<kratos::IfStmt>
            ((Stmt *)&expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  pp_Var1 = expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc]
            ._vptr__Sp_counted_base;
  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
          &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xc].
           _M_use_count;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  if (*(int *)(pp_Var1 + 0x2d) != 1) {
    bVar3 = false;
    goto LAB_00204de2;
  }
  Var::as<kratos::Expr>((Var *)local_48);
  if (*(_func_int **)((long)local_48 + 0x270) == (_func_int *)0x19) {
    if (*var == (Var *)0x0) {
      *var = *(Var **)((long)local_48 + 0x278);
    }
    else if (*var != *(Var **)((long)local_48 + 0x278)) goto LAB_00204dd1;
    if (((*(int *)(*(_func_int **)((long)local_48 + 0x280) + 0x168) != 3) &&
        (*(int *)(*(_func_int **)((long)local_48 + 0x280) + 0x168) != 5)) ||
       (0x10 < (ulong)((long)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[0xf]._vptr__Sp_counted_base[0x19] -
                      (long)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[0xf]._vptr__Sp_counted_base[0x18])))
    goto LAB_00204dd1;
    std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>::
    emplace_back<std::shared_ptr<kratos::IfStmt>&>
              ((vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>
                *)if_stmts,
               (shared_ptr<kratos::IfStmt> *)
               &expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    p_Var2 = expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             [0xf]._vptr__Sp_counted_base[0x18];
    if (p_Var2 == expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi[0xf]._vptr__Sp_counted_base[0x19]) {
      bVar3 = true;
    }
    else {
      stmt_00 = *(Stmt **)p_Var2;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var2 + 8);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      bVar3 = has_target_if(stmt_00,var,if_stmts);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
  }
  else {
LAB_00204dd1:
    bVar3 = false;
  }
  if (expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
LAB_00204de2:
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return bVar3;
}

Assistant:

bool static has_target_if(Stmt* stmt, Var*& var,
                              std::vector<std::shared_ptr<IfStmt>>& if_stmts) {
        // keep track of which statement are used later to transform into switch statement
        if (stmt->type() != StatementType::If && if_stmts.size() <= 1)
            return false;
        else if (stmt->type() != StatementType::If) {
            // we have reach the end of the if-else chain
            return true;
        }
        auto if_ = stmt->as<IfStmt>();
        auto predicate = if_->predicate();
        // predicate has to be a expression with equal comparison
        if (predicate->type() != VarType::Expression) return false;
        auto expr = predicate->as<Expr>();
        if (expr->op != ExprOp::Eq) return false;
        // has to be the same variable
        if (var == nullptr) {
            var = expr->left;
        } else {
            if (var != expr->left) return false;
        }
        if ((expr->right->type() != VarType::ConstValue) &&
            (expr->right->type() != VarType::Parameter))
            return false;
        if (if_->else_body()->size() > 1) return false;

        if_stmts.emplace_back(if_);
        if (if_->else_body()->empty()) {
            return true;
        } else {
            return has_target_if((*if_->else_body())[0].get(), var, if_stmts);
        }
    }